

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O0

void __thiscall onmt::Tokenizer::Options::Options(Options *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0x2d) = 0;
  *(undefined1 *)((long)in_RDI + 0x2e) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  *(undefined1 *)((long)in_RDI + 0x52) = 0;
  *(undefined1 *)((long)in_RDI + 0x53) = 0;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  *(undefined1 *)((long)in_RDI + 0x55) = 0;
  *(undefined1 *)((long)in_RDI + 0x56) = 0;
  *(undefined1 *)((long)in_RDI + 0x57) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14595e);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x14596c);
  return;
}

Assistant:

Options() = default;